

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableP<tcu::Vector<float,_3>_>::VariableP
          (VariableP<tcu::Vector<float,_3>_> *this,Variable<tcu::Vector<float,_3>_> *ptr)

{
  Variable<tcu::Vector<float,_3>_> *ptr_local;
  VariableP<tcu::Vector<float,_3>_> *this_local;
  
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>::
  SharedPtr(&this->
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_3>_>_>
            ,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}